

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O3

void __thiscall SolverTest_AddOption_Test::TestBody(SolverTest_AddOption_Test *this)

{
  bool bVar1;
  tuple<mp::SolverOption_*,_std::default_delete<mp::SolverOption>_> this_00;
  char ***pppcVar2;
  char *pcVar3;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  TestSolver s;
  AssertHelper local_420;
  Message local_418;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_410;
  __uniq_ptr_impl<mp::SolverOption,_std::default_delete<mp::SolverOption>_> local_408;
  AssertHelper local_400;
  undefined1 local_3f8 [32];
  pointer local_3d8;
  pointer local_3c8;
  TestSolver local_3b8;
  
  TestSolver::TestSolver(&local_3b8,(CStringRef)0x2150ec,(CStringRef)0x0,0,0);
  this_00.super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>.
  super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>)
       operator_new(0xd0);
  mp::SolverOption::SolverOption
            ((SolverOption *)
             this_00.
             super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>.
             super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl,"testopt",
             "A test option.",(ValueArrayRef)ZEXT816(0),false);
  *(undefined ***)
   this_00.super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>.
   super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl = &PTR__SolverOption_002879e0;
  *(undefined4 *)
   ((long)this_00.super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>
          .super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl + 0xcc) = 0;
  local_408._M_t.super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>.
  super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl =
       (tuple<mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>)
       (tuple<mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>)
       this_00.super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>.
       super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl;
  mp::SolverOptionManager::AddOption
            (&local_3b8.super_Solver.super_BasicSolver.super_SolverOptionManager,
             (OptionPtr *)&local_408);
  if ((_Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>)
      local_408._M_t.
      super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>.
      super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl != (SolverOption *)0x0) {
    (**(code **)(*(long *)local_408._M_t.
                          super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>
                          .super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl + 8))();
  }
  local_408._M_t.super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>.
  super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl =
       (tuple<mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>)
       (_Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>)0x0;
  pcVar3 = (char *)0x0;
  Args::Args((Args *)local_3f8,"testopt=42",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,
             (char *)0x0);
  pppcVar2 = Args::operator_cast_to_char___((Args *)local_3f8);
  bVar1 = mp::BasicSolver::ParseOptions
                    ((BasicSolver *)&local_3b8,*pppcVar2,1,(ASLProblem *)0x0,(char *)0x0);
  local_418.ss_.ptr_._0_4_ = CONCAT31(local_418.ss_.ptr_._1_3_,bVar1);
  local_410.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_3d8 != (pointer)0x0) {
    operator_delete(local_3d8,(long)local_3c8 - (long)local_3d8);
  }
  if ((pointer)local_3f8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_3f8._8_8_,local_3f8._24_8_ - local_3f8._8_8_);
  }
  if (local_418.ss_.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_420);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_3f8,(internal *)&local_418,
               (AssertionResult *)"s.ParseOptions(Args(\"testopt=42\"), Solver::NO_OPTION_ECHO)",
               "false","true",pcVar3);
    testing::internal::AssertHelper::AssertHelper
              (&local_400,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/solver-test.cc",
               0x277,(char *)CONCAT71(local_3f8._1_7_,local_3f8[0]));
    testing::internal::AssertHelper::operator=(&local_400,(Message *)&local_420);
    testing::internal::AssertHelper::~AssertHelper(&local_400);
    if ((undefined1 *)CONCAT71(local_3f8._1_7_,local_3f8[0]) != local_3f8 + 0x10) {
      operator_delete((undefined1 *)CONCAT71(local_3f8._1_7_,local_3f8[0]),
                      (ulong)(local_3f8._16_8_ + 1));
    }
    if (local_420.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_420.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_420.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_410,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_418.ss_.ptr_._0_4_ = 0x2a;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_3f8,"42","opt->value",(int *)&local_418,
             (int *)((long)this_00.
                           super__Tuple_impl<0UL,_mp::SolverOption_*,_std::default_delete<mp::SolverOption>_>
                           .super__Head_base<0UL,_mp::SolverOption_*,_false>._M_head_impl + 0xcc));
  if (local_3f8[0] == (internal)0x0) {
    testing::Message::Message(&local_418);
    if ((pointer)local_3f8._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_3f8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_420,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/solver-test.cc",
               0x278,pcVar3);
    testing::internal::AssertHelper::operator=(&local_420,&local_418);
    testing::internal::AssertHelper::~AssertHelper(&local_420);
    if (CONCAT44(local_418.ss_.ptr_._4_4_,local_418.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_418.ss_.ptr_._4_4_,local_418.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_418.ss_.ptr_._4_4_,local_418.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_3f8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_3b8.super_Solver.super_BasicSolver.super_ErrorHandler._vptr_ErrorHandler =
       (_func_int **)&PTR__TestSolver_00287ea0;
  local_3b8.super_Solver.super_BasicSolver.super_OutputHandler._vptr_OutputHandler =
       (_func_int **)&PTR__TestSolver_00287f10;
  local_3b8.super_Solver.super_BasicSolver.super_Interrupter._vptr_Interrupter =
       (_func_int **)&PTR__TestSolver_00287f38;
  local_3b8.super_Solver.super_BasicSolver.super_SolverOptionManager._vptr_SolverOptionManager =
       (_func_int **)&PTR__TestSolver_00287f68;
  local_3b8.super_Solver.super_BasicSolver.super_SolveResultRegistry._vptr_SolveResultRegistry =
       (_func_int **)&PTR__TestSolver_00287f88;
  testing::internal::FunctionMockerBase<int_(StrictMockProblemBuilder_&,_mp::SolutionHandler_&)>::
  ~FunctionMockerBase(&local_3b8.gmock2_DoSolve_92.
                       super_FunctionMockerBase<int_(StrictMockProblemBuilder_&,_mp::SolutionHandler_&)>
                     );
  local_3b8.super_Solver.super_BasicSolver.super_ErrorHandler._vptr_ErrorHandler =
       (_func_int **)&PTR__Solver_00287fd8;
  local_3b8.super_Solver.super_BasicSolver.super_OutputHandler._vptr_OutputHandler =
       (_func_int **)&PTR__Solver_00288048;
  local_3b8.super_Solver.super_BasicSolver.super_Interrupter._vptr_Interrupter =
       (_func_int **)&PTR__Solver_00288070;
  local_3b8.super_Solver.super_BasicSolver.super_SolverOptionManager._vptr_SolverOptionManager =
       (_func_int **)&PTR__Solver_002880a0;
  local_3b8.super_Solver.super_BasicSolver.super_SolveResultRegistry._vptr_SolveResultRegistry =
       (_func_int **)&PTR__Solver_002880c0;
  if (local_3b8.super_Solver.suffixes_.
      super__Vector_base<mp::Solver::SuffixInfo,_std::allocator<mp::Solver::SuffixInfo>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3b8.super_Solver.suffixes_.
                    super__Vector_base<mp::Solver::SuffixInfo,_std::allocator<mp::Solver::SuffixInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3b8.super_Solver.suffixes_.
                          super__Vector_base<mp::Solver::SuffixInfo,_std::allocator<mp::Solver::SuffixInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3b8.super_Solver.suffixes_.
                          super__Vector_base<mp::Solver::SuffixInfo,_std::allocator<mp::Solver::SuffixInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  mp::BasicSolver::~BasicSolver((BasicSolver *)&local_3b8);
  return;
}

Assistant:

TEST(SolverTest, AddOption) {
  struct TestOption : SolverOption {
    int value;
    TestOption() : SolverOption("testopt", "A test option."), value(0) {}

    void Write(fmt::Writer &) {}
    void Parse(const char *&s, bool=false) {
      char *end = 0;
      value = std::strtol(s, &end, 10);
      s = end;
    }
    virtual Option_Type type() { return BOOL; }
  };
  TestSolver s;
  TestOption *opt = 0;
  s.AddOption(SolverOptionPtr(opt = new TestOption()));
  EXPECT_TRUE(s.ParseOptions(Args("testopt=42"), Solver::NO_OPTION_ECHO));
  EXPECT_EQ(42, opt->value);
}